

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unfounded_check.cpp
# Opt level: O0

void __thiscall
Clasp::DefaultUnfoundedCheck::RemoveSource::operator()(RemoveSource *this,NodeId bodyId,uint32 idx)

{
  DefaultUnfoundedCheck *this_00;
  reference pBVar1;
  reference ppEVar2;
  ExtData *this_01;
  undefined4 in_EDX;
  size_type in_ESI;
  long *in_RDI;
  BodyPtr BVar3;
  ExtData *ext;
  BodyPtr n;
  DefaultUnfoundedCheck *in_stack_ffffffffffffffb0;
  undefined1 add;
  BodyPtr *n_00;
  
  add = (undefined1)((uint)in_EDX >> 0x18);
  BVar3 = getBody(in_stack_ffffffffffffffb0,(NodeId)((ulong)in_RDI >> 0x20));
  this_00 = (DefaultUnfoundedCheck *)BVar3.node;
  this_01 = (ExtData *)(*in_RDI + 0x98);
  pBVar1 = bk_lib::
           pod_vector<Clasp::DefaultUnfoundedCheck::BodyData,_std::allocator<Clasp::DefaultUnfoundedCheck::BodyData>_>
           ::operator[]((pod_vector<Clasp::DefaultUnfoundedCheck::BodyData,_std::allocator<Clasp::DefaultUnfoundedCheck::BodyData>_>
                         *)(*in_RDI + 0x38),in_ESI);
  ppEVar2 = bk_lib::
            pod_vector<Clasp::DefaultUnfoundedCheck::ExtData_*,_std::allocator<Clasp::DefaultUnfoundedCheck::ExtData_*>_>
            ::operator[]((pod_vector<Clasp::DefaultUnfoundedCheck::ExtData_*,_std::allocator<Clasp::DefaultUnfoundedCheck::ExtData_*>_>
                          *)this_01,pBVar1->lower_or_ext);
  n_00 = (BodyPtr *)*ppEVar2;
  Asp::PrgDepGraph::BodyNode::pred_weight
            ((BodyNode *)this_00,(uint32)((ulong)n_00 >> 0x20),SUB81((ulong)n_00 >> 0x18,0));
  ExtData::removeFromWs(this_01,(uint32)((ulong)in_RDI >> 0x20),(weight_t)in_RDI);
  if (0 < *(int *)&n_00->node) {
    pBVar1 = bk_lib::
             pod_vector<Clasp::DefaultUnfoundedCheck::BodyData,_std::allocator<Clasp::DefaultUnfoundedCheck::BodyData>_>
             ::operator[]((pod_vector<Clasp::DefaultUnfoundedCheck::BodyData,_std::allocator<Clasp::DefaultUnfoundedCheck::BodyData>_>
                           *)(*in_RDI + 0x38),BVar3.id);
    if (((ulong)*pBVar1 & 0x7fffffff) != 0) {
      forwardUnsource(this_00,n_00,(bool)add);
    }
  }
  return;
}

Assistant:

void DefaultUnfoundedCheck::RemoveSource::operator()(NodeId bodyId, uint32 idx) const {
	BodyPtr n(self->getBody(bodyId));
	ExtData* ext = self->extended_[self->bodies_[bodyId].lower_or_ext];
	ext->removeFromWs(idx, n.node->pred_weight(idx, false));
	if (ext->lower > 0 && self->bodies_[n.id].watches > 0) {
		// extended bodies don't always become false if a predecessor becomes false
		// eagerly enqueue all successors watching this body
		self->forwardUnsource(n, true);
	}
}